

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getOptionType(Highs *this,string *option,HighsOptionType *type)

{
  OptionStatus OVar1;
  
  OVar1 = getLocalOptionType(&(this->options_).super_HighsOptionsStruct.log_options,option,
                             &(this->options_).records,type);
  return -(uint)(OVar1 != kOk);
}

Assistant:

HighsStatus Highs::getOptionType(const std::string& option,
                                 HighsOptionType* type) const {
  if (getLocalOptionType(options_.log_options, option, options_.records,
                         type) == OptionStatus::kOk)
    return HighsStatus::kOk;
  return HighsStatus::kError;
}